

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool CheckMerkleRoot(CBlock *block,BlockValidationState *state)

{
  undefined1 auVar1 [16];
  bool bVar2;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool mutated;
  uint256 merkle_root;
  bool local_89;
  string local_88;
  string local_68;
  uint256 local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = true;
  if (block->m_checked_merkle_root == false) {
    BlockMerkleRoot(&local_48,block,&local_89);
    auVar1 = *(undefined1 (*) [16])
              ((block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems +
              0x10);
    auVar4[0] = -(local_48.super_base_blob<256U>.m_data._M_elems[0] ==
                 (block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0]
                 );
    auVar4[1] = -(local_48.super_base_blob<256U>.m_data._M_elems[1] ==
                 (block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1]
                 );
    auVar4[2] = -(local_48.super_base_blob<256U>.m_data._M_elems[2] ==
                 (block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2]
                 );
    auVar4[3] = -(local_48.super_base_blob<256U>.m_data._M_elems[3] ==
                 (block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3]
                 );
    auVar4[4] = -(local_48.super_base_blob<256U>.m_data._M_elems[4] ==
                 (block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4]
                 );
    auVar4[5] = -(local_48.super_base_blob<256U>.m_data._M_elems[5] ==
                 (block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5]
                 );
    auVar4[6] = -(local_48.super_base_blob<256U>.m_data._M_elems[6] ==
                 (block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6]
                 );
    auVar4[7] = -(local_48.super_base_blob<256U>.m_data._M_elems[7] ==
                 (block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7]
                 );
    auVar4[8] = -(local_48.super_base_blob<256U>.m_data._M_elems[8] ==
                 (block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8]
                 );
    auVar4[9] = -(local_48.super_base_blob<256U>.m_data._M_elems[9] ==
                 (block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9]
                 );
    auVar4[10] = -(local_48.super_base_blob<256U>.m_data._M_elems[10] ==
                  (block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [10]);
    auVar4[0xb] = -(local_48.super_base_blob<256U>.m_data._M_elems[0xb] ==
                   (block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0xb]);
    auVar4[0xc] = -(local_48.super_base_blob<256U>.m_data._M_elems[0xc] ==
                   (block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0xc]);
    auVar4[0xd] = -(local_48.super_base_blob<256U>.m_data._M_elems[0xd] ==
                   (block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0xd]);
    auVar4[0xe] = -(local_48.super_base_blob<256U>.m_data._M_elems[0xe] ==
                   (block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0xe]);
    auVar4[0xf] = -(local_48.super_base_blob<256U>.m_data._M_elems[0xf] ==
                   (block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                   [0xf]);
    auVar3[0] = -(local_48.super_base_blob<256U>.m_data._M_elems[0x10] == auVar1[0]);
    auVar3[1] = -(local_48.super_base_blob<256U>.m_data._M_elems[0x11] == auVar1[1]);
    auVar3[2] = -(local_48.super_base_blob<256U>.m_data._M_elems[0x12] == auVar1[2]);
    auVar3[3] = -(local_48.super_base_blob<256U>.m_data._M_elems[0x13] == auVar1[3]);
    auVar3[4] = -(local_48.super_base_blob<256U>.m_data._M_elems[0x14] == auVar1[4]);
    auVar3[5] = -(local_48.super_base_blob<256U>.m_data._M_elems[0x15] == auVar1[5]);
    auVar3[6] = -(local_48.super_base_blob<256U>.m_data._M_elems[0x16] == auVar1[6]);
    auVar3[7] = -(local_48.super_base_blob<256U>.m_data._M_elems[0x17] == auVar1[7]);
    auVar3[8] = -(local_48.super_base_blob<256U>.m_data._M_elems[0x18] == auVar1[8]);
    auVar3[9] = -(local_48.super_base_blob<256U>.m_data._M_elems[0x19] == auVar1[9]);
    auVar3[10] = -(local_48.super_base_blob<256U>.m_data._M_elems[0x1a] == auVar1[10]);
    auVar3[0xb] = -(local_48.super_base_blob<256U>.m_data._M_elems[0x1b] == auVar1[0xb]);
    auVar3[0xc] = -(local_48.super_base_blob<256U>.m_data._M_elems[0x1c] == auVar1[0xc]);
    auVar3[0xd] = -(local_48.super_base_blob<256U>.m_data._M_elems[0x1d] == auVar1[0xd]);
    auVar3[0xe] = -(local_48.super_base_blob<256U>.m_data._M_elems[0x1e] == auVar1[0xe]);
    auVar3[0xf] = -(local_48.super_base_blob<256U>.m_data._M_elems[0x1f] == auVar1[0xf]);
    auVar3 = auVar3 & auVar4;
    if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar3[0xf] >> 7) << 0xf) == 0xffff) {
      if (local_89 != true) {
        block->m_checked_merkle_root = true;
        goto LAB_00b117c2;
      }
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"bad-txns-duplicate","");
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"duplicate transaction","");
      bVar2 = ValidationState<BlockValidationResult>::Invalid
                        (&state->super_ValidationState<BlockValidationResult>,BLOCK_MUTATED,
                         &local_68,&local_88);
    }
    else {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"bad-txnmrklroot","");
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"hashMerkleRoot mismatch","");
      bVar2 = ValidationState<BlockValidationResult>::Invalid
                        (&state->super_ValidationState<BlockValidationResult>,BLOCK_MUTATED,
                         &local_68,&local_88);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
LAB_00b117c2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool CheckMerkleRoot(const CBlock& block, BlockValidationState& state)
{
    if (block.m_checked_merkle_root) return true;

    bool mutated;
    uint256 merkle_root = BlockMerkleRoot(block, &mutated);
    if (block.hashMerkleRoot != merkle_root) {
        return state.Invalid(
            /*result=*/BlockValidationResult::BLOCK_MUTATED,
            /*reject_reason=*/"bad-txnmrklroot",
            /*debug_message=*/"hashMerkleRoot mismatch");
    }

    // Check for merkle tree malleability (CVE-2012-2459): repeating sequences
    // of transactions in a block without affecting the merkle root of a block,
    // while still invalidating it.
    if (mutated) {
        return state.Invalid(
            /*result=*/BlockValidationResult::BLOCK_MUTATED,
            /*reject_reason=*/"bad-txns-duplicate",
            /*debug_message=*/"duplicate transaction");
    }

    block.m_checked_merkle_root = true;
    return true;
}